

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimSpecNode
          (Impl *this,int parent,int current,int level,bool is_parent_variant,
          PathIndexToSpecIndexMap *psmap,Layer *layer,optional<tinyusdz::PrimSpec> *primOut)

{
  Index *__x;
  uint __val;
  pointer pNVar1;
  bool bVar2;
  undefined1 uVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  size_type sVar7;
  mapped_type *fvs;
  ostream *poVar8;
  value_type *pvVar9;
  mapped_type *this_00;
  value_type *pvVar10;
  value_type *pvVar11;
  size_type sVar12;
  mapped_type *this_01;
  mapped_type *pmVar13;
  uint *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  Property *this_02;
  SpecType ty;
  pointer pSVar14;
  char *pcVar15;
  PrimMeta *this_03;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *poVar16;
  ulong uVar17;
  int current_local;
  int parent_local;
  optional<tinyusdz::Specifier> specifier;
  PropertyMap props;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  typeName;
  string prim_name;
  optional<tinyusdz::Specifier> specifier_1;
  string pTyName;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  variantPair;
  string variantSetName;
  string variantPrimName;
  string primTypeName;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> primChildren;
  Path elemPath;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> properties;
  ostringstream ss_e_14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e08 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_de8 [2];
  undefined1 local_dc8 [56];
  undefined1 local_d90 [208];
  ostringstream ss_e;
  undefined3 uStack_cbf;
  string local_cb8 [32];
  string local_c98 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  local_c60 [4];
  PrimMetas local_b88;
  PrimMeta primMeta;
  
  pNVar1 = (this->_nodes).
           super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  current_local = current;
  parent_local = parent;
  _ss_e = current;
  sVar4 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&psmap->_M_h,(key_type_conflict1 *)&ss_e);
  if (sVar4 == 0) {
    return true;
  }
  _ss_e = current;
  pmVar5 = ::std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)psmap,(key_type *)&ss_e);
  __val = *pmVar5;
  uVar17 = (ulong)__val;
  pSVar14 = (this->_specs).
            super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->_specs).
                     super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar14) / 0xc) <= uVar17) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xafd);
    ::std::operator<<(poVar8," ");
    ::std::__cxx11::to_string((string *)&props,__val);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variantPair,"Invalid specifier id: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&props);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&elemPath,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variantPair,". Must be in range [0, ");
    std::__cxx11::to_string
              ((string *)&typeName,
               ((long)(this->_specs).
                      super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_specs).
                     super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e_14,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&elemPath,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&typeName)
    ;
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&primMeta,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e_14,
                     ")");
    poVar8 = ::std::operator<<((ostream *)&ss_e,(string *)&primMeta);
    ::std::operator<<(poVar8,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&primMeta);
    ::std::__cxx11::string::_M_dispose();
    goto LAB_00161a8a;
  }
  if (((pSVar14[uVar17].spec_type == Relationship) || (pSVar14[uVar17].spec_type == Attribute)) &&
     (sVar6 = ::std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        (&this->_prim_table,&parent_local), sVar6 != 0)) {
    return true;
  }
  pSVar14 = pSVar14 + uVar17;
  __x = &pSVar14->fieldset_index;
  sVar7 = ::std::
          map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
          ::count(&this->_live_fieldsets,__x);
  if (sVar7 == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xb13);
    ::std::operator<<(poVar8," ");
    ::std::__cxx11::to_string(&elemPath._prim_part,__x->value);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e_14,
                     "FieldSet id: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&elemPath)
    ;
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&primMeta,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e_14,
                     " must exist in live fieldsets.");
    poVar8 = ::std::operator<<((ostream *)&ss_e,(string *)&primMeta);
    ::std::operator<<(poVar8,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
LAB_0016100a:
    ::std::__cxx11::stringbuf::str();
    goto LAB_00161a77;
  }
  fvs = ::std::
        map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
        ::at(&this->_live_fieldsets,__x);
  if ((ulong)(this->_config).kMaxFieldValuePairs <
      (ulong)(((long)(fvs->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
              (long)(fvs->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) / 0x38)) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,"[USDC]");
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xb1b);
    ::std::operator<<(poVar8," ");
    pcVar15 = "Too much FieldValue pairs.";
LAB_00160edf:
    poVar8 = ::std::operator<<((ostream *)&ss_e,pcVar15);
    ::std::operator<<(poVar8,"\n");
    ::std::__cxx11::stringbuf::str();
    goto LAB_00161a77;
  }
  if (current_local == 0) {
    GetElemPath((optional<tinyusdz::Path> *)&primMeta,this,(Index)0x0);
    if (primMeta.active.has_value_ == false) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xb2c);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)&ss_e,"(Internal error). Root Element Path not found.");
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&ss_e_14);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      this_03 = &primMeta;
LAB_00161227:
      nonstd::optional_lite::optional<tinyusdz::Path>::~optional
                ((optional<tinyusdz::Path> *)this_03);
      return false;
    }
    nonstd::optional_lite::optional<tinyusdz::Path>::~optional
              ((optional<tinyusdz::Path> *)&primMeta);
    if (pSVar14->spec_type == PseudoRoot) {
      bVar2 = ReconstrcutStageMeta(this,fvs,&layer->_metas);
      if (bVar2) {
        ::std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &this->_prim_table,&current_local);
        return true;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xb36);
      ::std::operator<<(poVar8," ");
      pcVar15 = "Failed to reconstruct StageMeta.";
      goto LAB_00160edf;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xb32);
    ::std::operator<<(poVar8," ");
    pcVar15 = "SpecTypePseudoRoot expected for root layer(Stage) element.";
    goto LAB_00161a43;
  }
  args = &switchD_00161050::switchdataD_003092f4;
  switch(pSVar14->spec_type) {
  case Unknown:
  case Invalid:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,"[USDC]");
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xcc8);
    ::std::operator<<(poVar8," ");
    pcVar15 = "[InternalError] Invalid SpecType.";
    break;
  case Attribute:
    if (!is_parent_variant) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar8 = ::std::operator<<((ostream *)&ss_e,"[warn]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xcb3);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)&ss_e,
                                 "TODO: SpecTypeAttribute(in conjunction with Class/Over specifier, or inherited?)"
                                );
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::stringbuf::str();
      PushWarn(this,(string *)&primMeta);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      return true;
    }
    GetPath((optional<tinyusdz::Path> *)&ss_e,this,(Index)(pSVar14->path_index).value);
    nonstd::optional_lite::optional<tinyusdz::Path>::optional<tinyusdz::Path,_0>
              ((optional<tinyusdz::Path> *)&ss_e_14,(optional<tinyusdz::Path> *)&ss_e);
    nonstd::optional_lite::optional<tinyusdz::Path>::~optional((optional<tinyusdz::Path> *)&ss_e);
    if (ss_e_14 == (ostringstream)0x0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,"[USDC]");
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xc9c);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)&ss_e,"Invalid PathIndex.");
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&primMeta);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      this_03 = (PrimMeta *)&ss_e_14;
      goto LAB_00161227;
    }
    this_02 = (Property *)&primMeta;
    Property::Property(this_02);
    uVar3 = ParseProperty(this,pSVar14->spec_type,fvs,this_02);
    if ((bool)uVar3) {
      pvVar9 = nonstd::optional_lite::optional<tinyusdz::Path>::value
                         ((optional<tinyusdz::Path> *)&ss_e_14);
      ::std::pair<tinyusdz::Path,_tinyusdz::Property>::
      pair<tinyusdz::Path_&,_tinyusdz::Property_&,_true>
                ((pair<tinyusdz::Path,_tinyusdz::Property> *)&ss_e,pvVar9,(Property *)&primMeta);
      this_00 = ::std::
                map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                ::operator[](&this->_variantProps,&current_local);
      ::std::pair<tinyusdz::Path,_tinyusdz::Property>::operator=
                (this_00,(pair<tinyusdz::Path,_tinyusdz::Property> *)&ss_e);
      ::std::pair<tinyusdz::Path,_tinyusdz::Property>::~pair
                ((pair<tinyusdz::Path,_tinyusdz::Property> *)&ss_e);
      pmVar13 = ::std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&this->_variantPropChildren,&parent_local);
      ::std::vector<int,_std::allocator<int>_>::push_back(pmVar13,&current_local);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,"[USDC]");
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xca3);
      ::std::operator<<(poVar8," ");
      ::std::__cxx11::string::string
                ((string *)&variantPair,"Failed to parse Attribut: {}.",(allocator *)&props);
      pvVar9 = nonstd::optional_lite::optional<tinyusdz::Path>::value
                         ((optional<tinyusdz::Path> *)&ss_e_14);
      fmt::format<std::__cxx11::string>
                ((string *)&elemPath,(fmt *)&variantPair,(string *)&pvVar9->_prop_part,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
      poVar8 = ::std::operator<<((ostream *)&ss_e,(string *)&elemPath);
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,&elemPath._prim_part);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    Property::~Property((Property *)&primMeta);
    nonstd::optional_lite::optional<tinyusdz::Path>::~optional((optional<tinyusdz::Path> *)&ss_e_14)
    ;
    goto joined_r0x001631be;
  case Connection:
  case Relationship:
  case RelationshipTarget:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,"[USDC]");
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xcbc);
    ::std::operator<<(poVar8," ");
    pcVar15 = "TODO: Unsupported/Unimplemented SpecType: {}.";
    goto LAB_001612be;
  case Expression:
  case Mapper:
  case MapperArg:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,"[USDC]");
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xcc3);
    ::std::operator<<(poVar8," ");
    pcVar15 = "Unsupported SpecType: {}.";
LAB_001612be:
    ::std::__cxx11::string::string((string *)&ss_e_14,pcVar15,(allocator *)&variantPair);
    tinyusdz::to_string_abi_cxx11_(&elemPath._prim_part,(tinyusdz *)(ulong)pSVar14->spec_type,ty);
    fmt::format<std::__cxx11::string>
              ((string *)&primMeta,(fmt *)&ss_e_14,(string *)&elemPath,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar8 = ::std::operator<<((ostream *)&ss_e,(string *)&primMeta);
    ::std::operator<<(poVar8,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    goto LAB_00161a5a;
  case Prim:
    props._M_t._M_impl._0_1_ = 0;
    specifier_1.has_value_ = false;
    specifier_1.contained = (storage_t<tinyusdz::Specifier>)0x0;
    props._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    props._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    props._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    props._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    variantSetName._M_dataplus._M_p = (pointer)0x0;
    variantSetName._M_string_length = 0;
    variantSetName.field_2._M_allocated_capacity = 0;
    variantPrimName._M_dataplus._M_p = (pointer)0x0;
    variantPrimName._M_string_length = 0;
    variantPrimName.field_2._M_allocated_capacity = 0;
    PrimMetas::PrimMetas(&primMeta);
    bVar2 = ParsePrimSpec(this,fvs,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&props,&specifier_1,
                          (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                          &variantSetName,
                          (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                          &variantPrimName,&primMeta);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,"[USDC]");
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xb50);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)&ss_e,"Failed to parse Prim fields.");
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&ss_e_14);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      PrimMetas::~PrimMetas(&primMeta);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&variantPrimName);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&variantSetName);
      poVar16 = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&props;
LAB_00161cb4:
      nonstd::optional_lite::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(poVar16);
      return false;
    }
    elemPath._prim_part._M_dataplus._M_p = (pointer)&elemPath._prim_part.field_2;
    elemPath._prim_part._M_string_length = 0;
    elemPath._prim_part.field_2._M_allocated_capacity =
         elemPath._prim_part.field_2._M_allocated_capacity & 0xffffffffffffff00;
    elemPath._prop_part._M_dataplus._M_p = (pointer)&elemPath._prop_part.field_2;
    elemPath._prop_part._M_string_length = 0;
    elemPath._prop_part.field_2._M_local_buf[0] = '\0';
    elemPath._variant_part._M_dataplus._M_p = (pointer)&elemPath._variant_part.field_2;
    elemPath._variant_part._M_string_length = 0;
    elemPath._variant_part.field_2._M_local_buf[0] = '\0';
    elemPath._variant_selection_part._M_dataplus._M_p =
         (pointer)&elemPath._variant_selection_part.field_2;
    elemPath._variant_selection_part._M_string_length = 0;
    elemPath._variant_selection_part.field_2._M_local_buf[0] = '\0';
    elemPath._variant_part_str._M_dataplus._M_p = (pointer)&elemPath._variant_part_str.field_2;
    elemPath._variant_part_str._M_string_length = 0;
    elemPath._variant_part_str.field_2._M_local_buf[0] = '\0';
    elemPath._element._M_dataplus._M_p = (pointer)&elemPath._element.field_2;
    elemPath._element._M_string_length = 0;
    elemPath._element.field_2._M_local_buf[0] = '\0';
    elemPath._path_type.has_value_ = false;
    elemPath._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    elemPath._valid = false;
    GetElemPath((optional<tinyusdz::Path> *)&ss_e_14,this,(Index)current_local);
    if (ss_e_14 == (ostringstream)0x1) {
      pvVar9 = nonstd::optional_lite::optional<tinyusdz::Path>::value
                         ((optional<tinyusdz::Path> *)&ss_e_14);
      Path::operator=(&elemPath,pvVar9);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,"[USDC]");
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xb5d);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)&ss_e,"(Internal errror) Element path not found.");
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,variantPair._M_elems);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    nonstd::optional_lite::optional<tinyusdz::Path>::~optional((optional<tinyusdz::Path> *)&ss_e_14)
    ;
    if (ss_e_14 == (ostringstream)0x0) {
LAB_0016230d:
      uVar3 = false;
    }
    else {
      if (specifier_1.has_value_ == true) {
        pvVar10 = nonstd::optional_lite::optional<tinyusdz::Specifier>::value(&specifier_1);
        if (((*pvVar10 != Def) &&
            (pvVar10 = nonstd::optional_lite::optional<tinyusdz::Specifier>::value(&specifier_1),
            *pvVar10 != Class)) &&
           (pvVar10 = nonstd::optional_lite::optional<tinyusdz::Specifier>::value(&specifier_1),
           *pvVar10 != Over)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,"[USDC]");
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xb69);
          ::std::operator<<(poVar8," ");
          poVar8 = ::std::operator<<((ostream *)&ss_e,"Invalid Specifier.");
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&ss_e_14);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          goto LAB_0016230d;
        }
      }
      else {
        _ss_e = CONCAT31(uStack_cbf,1);
        nonstd::optional_lite::optional<tinyusdz::Specifier>::operator=
                  (&specifier_1,(optional<tinyusdz::Specifier> *)&ss_e);
      }
      typeName._0_8_ = (long)&typeName.contained.data + 8;
      typeName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      typeName.contained._8_8_ = typeName.contained._8_8_ & 0xffffffffffffff00;
      if (props._M_t._M_impl._0_1_ == '\0') {
        ::std::__cxx11::string::assign(&typeName.has_value_);
      }
      else {
        nonstd::optional_lite::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&props);
        ::std::__cxx11::string::_M_assign((string *)&typeName);
      }
      ::std::__cxx11::string::string((string *)&pTyName,(string *)&elemPath);
      if (props._M_t._M_impl._0_1_ == '\x01') {
        pvVar11 = nonstd::optional_lite::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&props);
        ::std::__cxx11::string::string((string *)&prim_name,(string *)pvVar11);
      }
      else {
        ::std::__cxx11::string::string((string *)&prim_name,"",(allocator *)&ss_e);
      }
      if (props._M_t._M_impl._0_1_ == '\x01') {
        pvVar11 = nonstd::optional_lite::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&props);
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)pvVar11,"__AnyType__");
        if (bVar2) {
          ::std::__cxx11::string::assign((char *)&prim_name);
        }
      }
      bVar2 = ValidatePrimElementName(&pTyName);
      if (bVar2) {
        PrimSpec::PrimSpec((PrimSpec *)&ss_e);
        ::std::__cxx11::string::_M_assign(local_cb8);
        ::std::__cxx11::string::_M_assign(local_c98);
        variantPair._M_elems[0].field_2._8_8_ = &variantPair._M_elems[0]._M_string_length;
        variantPair._M_elems[0]._M_string_length._0_4_ = 0;
        variantPair._M_elems[0].field_2._M_allocated_capacity = 0;
        variantPair._M_elems[1]._M_string_length = 0;
        variantPair._M_elems[1]._M_dataplus._M_p = (pointer)variantPair._M_elems[0].field_2._8_8_;
        uVar3 = BuildPropertyMap(this,&pNVar1[current]._children,psmap,(PropertyMap *)&variantPair);
        if ((bool)uVar3) {
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::operator=(local_c60,
                      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *)&variantPair);
          PrimMetas::operator=(&local_b88,&primMeta);
          if (primOut != (optional<tinyusdz::PrimSpec> *)0x0) {
            nonstd::optional_lite::optional<tinyusdz::PrimSpec>::operator=
                      (primOut,(PrimSpec *)&ss_e);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_14);
          poVar8 = ::std::operator<<((ostream *)&ss_e_14,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,"[USDC]");
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xba8);
          ::std::operator<<(poVar8," ");
          poVar8 = ::std::operator<<((ostream *)&ss_e_14,"Failed to build PropertyMap.");
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&primTypeName);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_14);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)&variantPair);
        PrimSpec::~PrimSpec((PrimSpec *)&ss_e);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,"[USDC]");
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xb84);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)&ss_e,"Invalid Prim name.");
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&ss_e_14);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        uVar3 = false;
      }
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if ((bool)uVar3 != false) {
        sVar6 = ::std::set<int,_std::less<int>,_std::allocator<int>_>::count
                          (&this->_prim_table,&current_local);
        if (sVar6 == 0) {
          ::std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->_prim_table,&current_local);
        }
      }
      ::std::__cxx11::string::_M_dispose();
    }
    Path::~Path(&elemPath);
    PrimMetas::~PrimMetas(&primMeta);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&variantPrimName);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&variantSetName);
    poVar16 = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&props;
    goto LAB_001631b6;
  case PseudoRoot:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,"[USDC]");
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xb43);
    ::std::operator<<(poVar8," ");
    pcVar15 = "SpecType PseudoRoot in a child node is not supported(yet)";
    break;
  case Variant:
    typeName._0_8_ = typeName._0_8_ & 0xffffffffffffff00;
    specifier.has_value_ = false;
    specifier.contained = (storage_t<tinyusdz::Specifier>)0x0;
    typeName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    typeName.contained._8_8_ = 0;
    typeName.contained._16_8_ = 0;
    typeName.contained._24_8_ = 0;
    primChildren.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    primChildren.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    primChildren.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    PrimMetas::PrimMetas(&primMeta);
    bVar2 = ParsePrimSpec(this,fvs,&typeName,&specifier,&primChildren,&properties,&primMeta);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,"[USDC]");
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xc03);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)&ss_e,"Failed to parse Prim fields under Variant.");
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&ss_e_14);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      PrimMetas::~PrimMetas(&primMeta);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&properties);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&primChildren);
      poVar16 = &typeName;
      goto LAB_00161cb4;
    }
    elemPath._prim_part._M_dataplus._M_p = (pointer)&elemPath._prim_part.field_2;
    elemPath._prim_part._M_string_length = 0;
    args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    elemPath._prim_part.field_2._M_allocated_capacity =
         elemPath._prim_part.field_2._M_allocated_capacity & 0xffffffffffffff00;
    elemPath._prop_part._M_dataplus._M_p = (pointer)&elemPath._prop_part.field_2;
    elemPath._prop_part._M_string_length = 0;
    elemPath._prop_part.field_2._M_local_buf[0] = '\0';
    elemPath._variant_part._M_dataplus._M_p = (pointer)&elemPath._variant_part.field_2;
    elemPath._variant_part._M_string_length = 0;
    elemPath._variant_part.field_2._M_local_buf[0] = '\0';
    elemPath._variant_selection_part._M_dataplus._M_p =
         (pointer)&elemPath._variant_selection_part.field_2;
    elemPath._variant_selection_part._M_string_length = 0;
    elemPath._variant_selection_part.field_2._M_local_buf[0] = '\0';
    elemPath._variant_part_str._M_dataplus._M_p = (pointer)&elemPath._variant_part_str.field_2;
    elemPath._variant_part_str._M_string_length = 0;
    elemPath._variant_part_str.field_2._M_local_buf[0] = '\0';
    elemPath._element._M_dataplus._M_p = (pointer)&elemPath._element.field_2;
    elemPath._element._M_string_length = 0;
    elemPath._element.field_2._M_local_buf[0] = '\0';
    elemPath._path_type.has_value_ = false;
    elemPath._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    elemPath._valid = false;
    GetElemPath((optional<tinyusdz::Path> *)&ss_e_14,this,(Index)current_local);
    if (ss_e_14 == (ostringstream)0x1) {
      pvVar9 = nonstd::optional_lite::optional<tinyusdz::Path>::value
                         ((optional<tinyusdz::Path> *)&ss_e_14);
      Path::operator=(&elemPath,pvVar9);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,"[USDC]");
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xc0f);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)&ss_e,"(Internal errror) Element path not found.");
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,variantPair._M_elems);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    nonstd::optional_lite::optional<tinyusdz::Path>::~optional((optional<tinyusdz::Path> *)&ss_e_14)
    ;
    if (ss_e_14 == (ostringstream)0x0) {
LAB_001620ec:
      uVar3 = false;
    }
    else {
      if (specifier.has_value_ == true) {
        pvVar10 = nonstd::optional_lite::optional<tinyusdz::Specifier>::value(&specifier);
        if (((*pvVar10 != Def) &&
            (pvVar10 = nonstd::optional_lite::optional<tinyusdz::Specifier>::value(&specifier),
            *pvVar10 != Class)) &&
           (pvVar10 = nonstd::optional_lite::optional<tinyusdz::Specifier>::value(&specifier),
           *pvVar10 != Over)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,"[USDC]");
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xc1b);
          ::std::operator<<(poVar8," ");
          poVar8 = ::std::operator<<((ostream *)&ss_e,"Invalid Specifier.");
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&ss_e_14);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          goto LAB_001620ec;
        }
      }
      else {
        _ss_e = CONCAT31(uStack_cbf,1);
        nonstd::optional_lite::optional<tinyusdz::Specifier>::operator=
                  (&specifier,(optional<tinyusdz::Specifier> *)&ss_e);
      }
      pTyName._M_dataplus._M_p = (pointer)&pTyName.field_2;
      pTyName._M_string_length = 0;
      pTyName.field_2._M_local_buf[0] = '\0';
      if (typeName.has_value_ == false) {
        ::std::__cxx11::string::assign((char *)&pTyName);
      }
      else {
        nonstd::optional_lite::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        value(&typeName);
        ::std::__cxx11::string::_M_assign((string *)&pTyName);
      }
      ::std::__cxx11::string::string((string *)&prim_name,(string *)&elemPath);
      if (typeName.has_value_ == true) {
        pvVar11 = nonstd::optional_lite::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&typeName);
        ::std::__cxx11::string::string((string *)&primTypeName,(string *)pvVar11);
      }
      else {
        ::std::__cxx11::string::string((string *)&primTypeName,"",(allocator *)&ss_e);
      }
      if (typeName.has_value_ == true) {
        pvVar11 = nonstd::optional_lite::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&typeName);
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)pvVar11,"__AnyType__");
        if (bVar2) {
          ::std::__cxx11::string::assign((char *)&primTypeName);
        }
      }
      ::std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
      array(&variantPair);
      bVar2 = tokenize_variantElement(&prim_name,&variantPair);
      if (bVar2) {
        ::std::__cxx11::string::string((string *)&variantSetName,(string *)&variantPair);
        ::std::__cxx11::string::string
                  ((string *)&variantPrimName,(string *)(variantPair._M_elems + 1));
        bVar2 = ValidatePrimElementName(&variantPrimName);
        if (bVar2) {
          PrimSpec::PrimSpec((PrimSpec *)&ss_e);
          ::std::__cxx11::string::_M_assign(local_cb8);
          ::std::__cxx11::string::_M_assign(local_c98);
          props._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &props._M_t._M_impl.super__Rb_tree_header._M_header;
          props._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               (ulong)(uint)props._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
          props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          props._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          props._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               props._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          uVar3 = BuildPropertyMap(this,&pNVar1[current]._children,psmap,&props);
          if ((bool)uVar3) {
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::operator=(local_c60,&props._M_t);
            PrimMetas::operator=(&local_b88,&primMeta);
            sVar12 = ::std::
                     map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                     ::count(&this->_variantPrimSpecs,&current_local);
            if (sVar12 == 0) {
              this_01 = ::std::
                        map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                        ::operator[](&this->_variantPrimSpecs,&current_local);
              PrimSpec::operator=(this_01,(PrimSpec *)&ss_e);
              pmVar13 = ::std::
                        map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                        ::operator[](&this->_variantPrimChildren,&parent_local);
              ::std::vector<int,_std::allocator<int>_>::push_back(pmVar13,&current_local);
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_14);
            poVar8 = ::std::operator<<((ostream *)&ss_e_14,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,"[USDC]");
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xc84);
            ::std::operator<<(poVar8," ");
            poVar8 = ::std::operator<<((ostream *)&ss_e_14,"Failed to build PropertyMap.");
            ::std::operator<<(poVar8,"\n");
            ::std::__cxx11::stringbuf::str();
            PushError(this,(string *)&specifier_1);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_14);
          }
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::~_Rb_tree(&props._M_t);
          PrimSpec::~PrimSpec((PrimSpec *)&ss_e);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,"[USDC]");
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xc45);
          ::std::operator<<(poVar8," ");
          ::std::__cxx11::string::string
                    ((string *)&props,"Invalid Prim name in Variant: `{}`",(allocator *)&specifier_1
                    );
          fmt::format<std::__cxx11::string>
                    ((string *)&ss_e_14,(fmt *)&props,(string *)&variantPrimName,args_00);
          poVar8 = ::std::operator<<((ostream *)&ss_e,(string *)&ss_e_14);
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&ss_e_14);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          uVar3 = false;
        }
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,"[USDC]");
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xc3c);
        ::std::operator<<(poVar8," ");
        ::std::__cxx11::string::string
                  ((string *)&props,"Invalid Variant ElementPath \'{}\'.",
                   (allocator *)&variantSetName);
        fmt::format<tinyusdz::Path>((string *)&ss_e_14,(string *)&props,&elemPath);
        poVar8 = ::std::operator<<((ostream *)&ss_e,(string *)&ss_e_14);
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&ss_e_14);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        uVar3 = false;
      }
      ::std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
      ~array(&variantPair);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    Path::~Path(&elemPath);
    PrimMetas::~PrimMetas(&primMeta);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&properties);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&primChildren);
    poVar16 = &typeName;
LAB_001631b6:
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional(poVar16);
joined_r0x001631be:
    if ((bool)uVar3 == false) {
      return false;
    }
LAB_00161a91:
    return true;
  case VariantSet:
    sVar6 = ::std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      (&this->_prim_table,&parent_local);
    if (sVar6 == 0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,"[USDC]");
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xbc3);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)&ss_e,"Parent Prim for this VariantSet not found.");
      ::std::operator<<(poVar8,"\n");
      goto LAB_0016100a;
    }
    _ss_e_14 = (pointer)&local_e28;
    local_e28._M_local_buf[0] = '\0';
    local_e18._M_allocated_capacity = (size_type)local_e08;
    local_e18._8_8_ = 0;
    local_e08[0]._M_local_buf[0] = '\0';
    local_e08[1]._0_8_ = local_de8;
    local_e08[1]._8_8_ = 0;
    local_de8[0]._M_local_buf[0] = '\0';
    local_de8[1]._0_8_ = local_dc8;
    local_de8[1]._8_8_ = 0;
    local_dc8[0] = '\0';
    local_dc8._16_8_ = local_dc8 + 0x20;
    local_dc8._24_8_ = 0;
    local_dc8[0x20] = '\0';
    local_dc8._48_8_ = local_d90 + 8;
    local_d90._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_d90[8] = '\0';
    local_d90[0x18] = 0;
    local_d90._28_4_ = 0;
    local_d90[0x20] = 0;
    GetElemPath((optional<tinyusdz::Path> *)&primMeta,this,(Index)current_local);
    if (primMeta.active.has_value_ == true) {
      pvVar9 = nonstd::optional_lite::optional<tinyusdz::Path>::value
                         ((optional<tinyusdz::Path> *)&primMeta);
      Path::operator=((Path *)&ss_e_14,pvVar9);
      Path::full_path_name_abi_cxx11_((string *)&ss_e,(Path *)&ss_e_14);
      bVar2 = tokenize_variantElement
                        ((string *)&ss_e,
                         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                          *)0x0);
      ::std::__cxx11::string::_M_dispose();
      if (bVar2) {
        nonstd::optional_lite::optional<tinyusdz::Path>::~optional
                  ((optional<tinyusdz::Path> *)&primMeta);
        elemPath._prim_part._M_dataplus._M_p = (pointer)0x0;
        elemPath._prim_part._M_string_length = 0;
        elemPath._prim_part.field_2._M_allocated_capacity = 0;
        bVar2 = ParseVariantSetFields
                          (this,fvs,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                    &elemPath);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,"[USDC]");
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xbe3);
          ::std::operator<<(poVar8," ");
          poVar8 = ::std::operator<<((ostream *)&ss_e,"Failed to parse VariantSet fields.");
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&primMeta);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&elemPath);
          goto LAB_00162520;
        }
        uVar3 = AddVariantChildrenToPrimNode
                          (this,parent_local,
                           (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&elemPath);
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&elemPath);
        Path::~Path((Path *)&ss_e_14);
        goto joined_r0x001631be;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,"[USDC]");
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xbd4);
      ::std::operator<<(poVar8," ");
      ::std::__cxx11::string::string
                ((string *)variantPair._M_elems,"Invalid Variant ElementPath \'{}\'.",
                 (allocator *)&props);
      fmt::format<tinyusdz::Path>(&elemPath._prim_part,variantPair._M_elems,(Path *)&ss_e_14);
      poVar8 = ::std::operator<<((ostream *)&ss_e,(string *)&elemPath);
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,"[USDC]");
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecNode");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xbd9);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)&ss_e,"(Internal errror) Element path not found.");
      ::std::operator<<(poVar8,"\n");
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,&elemPath._prim_part);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    nonstd::optional_lite::optional<tinyusdz::Path>::~optional
              ((optional<tinyusdz::Path> *)&primMeta);
LAB_00162520:
    Path::~Path((Path *)&ss_e_14);
    return false;
  default:
    goto LAB_00161a91;
  }
LAB_00161a43:
  poVar8 = ::std::operator<<((ostream *)&ss_e,pcVar15);
  ::std::operator<<(poVar8,"\n");
LAB_00161a5a:
  ::std::__cxx11::stringbuf::str();
LAB_00161a77:
  PushError(this,(string *)&primMeta);
  ::std::__cxx11::string::_M_dispose();
LAB_00161a8a:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  return false;
}

Assistant:

bool USDCReader::Impl::ReconstructPrimSpecNode(int parent, int current, int level,
                                           bool is_parent_variant,
                                           const PathIndexToSpecIndexMap &psmap,
                                           Layer *layer,
                                           nonstd::optional<PrimSpec> *primOut) {
  (void)level;
  const crate::CrateReader::Node &node = _nodes[size_t(current)];

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  std::cout << pprint::Indent(uint32_t(level)) << "lv[" << level
            << "] node_index[" << current << "] " << node.GetLocalPath()
            << " ==\n";
  std::cout << pprint::Indent(uint32_t(level)) << " childs = [";
  for (size_t i = 0; i < node.GetChildren().size(); i++) {
    std::cout << node.GetChildren()[i];
    if (i != (node.GetChildren().size() - 1)) {
      std::cout << ", ";
    }
  }
  std::cout << "] (is_parent_variant = " << is_parent_variant << ")\n";
#endif

  if (!psmap.count(uint32_t(current))) {
    // No specifier assigned to this node.
    DCOUT("No specifier assigned to this node: " << current);
    return true;  // would be OK.
  }

  uint32_t spec_index = psmap.at(uint32_t(current));
  if (spec_index >= _specs.size()) {
    PUSH_ERROR("Invalid specifier id: " + std::to_string(spec_index) +
               ". Must be in range [0, " + std::to_string(_specs.size()) + ")");
    return false;
  }

  const crate::Spec &spec = _specs[spec_index];

  DCOUT(pprint::Indent(uint32_t(level))
        << "  specTy = " << to_string(spec.spec_type));
  DCOUT(pprint::Indent(uint32_t(level))
        << "  fieldSetIndex = " << spec.fieldset_index.value);

  if ((spec.spec_type == SpecType::Attribute) ||
      (spec.spec_type == SpecType::Relationship)) {
    if (_prim_table.count(parent)) {
      // This node is a Properties node. These are processed in
      // ReconstructPrim(), so nothing to do here.
      return true;
    }
  }

  if (!_live_fieldsets.count(spec.fieldset_index)) {
    PUSH_ERROR("FieldSet id: " + std::to_string(spec.fieldset_index.value) +
               " must exist in live fieldsets.");
    return false;
  }

  const crate::FieldValuePairVector &fvs =
      _live_fieldsets.at(spec.fieldset_index);

  if (fvs.size() > _config.kMaxFieldValuePairs) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too much FieldValue pairs.");
  }

#if defined(TINYUSDZ_LOCAL_DEBUG_PRINT)
  // DBG
  for (auto &fv : fvs) {
    DCOUT("parent[" << current << "] level [" << level << "] fv name "
                    << fv.first << "(type = " << fv.second.type_name() << ")");
  }
#endif

  // StageMeta = root only attributes.
  // TODO: Unify reconstrction code with USDAReder?
  if (current == 0) {
    if (const auto &pv = GetElemPath(crate::Index(uint32_t(current)))) {
      DCOUT("Root element path: " << pv.value().full_path_name());
    } else {
      PUSH_ERROR_AND_RETURN("(Internal error). Root Element Path not found.");
    }

    // Root layer(Stage) is PseudoRoot spec type.
    if (spec.spec_type != SpecType::PseudoRoot) {
      PUSH_ERROR_AND_RETURN(
          "SpecTypePseudoRoot expected for root layer(Stage) element.");
    }

    if (!ReconstrcutStageMeta(fvs, &layer->metas())) {
      PUSH_ERROR_AND_RETURN("Failed to reconstruct StageMeta.");
    }

    // TODO: Validate scene using `StageMetas::primChildren`.

    _prim_table.insert(current);

    return true;
  }

  switch (spec.spec_type) {
    case SpecType::PseudoRoot: {
      PUSH_ERROR_AND_RETURN_TAG(
          kTag, "SpecType PseudoRoot in a child node is not supported(yet)");
    }
    case SpecType::Prim: {
      nonstd::optional<std::string> typeName;
      nonstd::optional<Specifier> specifier;
      std::vector<value::token> primChildren;
      std::vector<value::token> properties;

      PrimMeta primMeta;

      DCOUT("== PrimFields begin ==> ");

      if (!ParsePrimSpec(fvs, typeName, specifier, primChildren, properties, primMeta)) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to parse Prim fields.");
        return false;
      }

      DCOUT("<== PrimFields end ===");

      Path elemPath;

      if (const auto &pv = GetElemPath(crate::Index(uint32_t(current)))) {
        DCOUT(fmt::format("Element path: {}", pv.value().full_path_name()));
        elemPath = pv.value();
      } else {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "(Internal errror) Element path not found.");
      }

      // Sanity check
      if (specifier) {
        if (specifier.value() == Specifier::Def) {
          // ok
        } else if (specifier.value() == Specifier::Class) {
          // ok
        } else if (specifier.value() == Specifier::Over) {
          // ok
        } else {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Specifier.");
        }
      } else {
        // Default = Over Prim.
        specifier = Specifier::Over;
      }

      std::string pTyName;
      if (!typeName) {
        //PUSH_WARN("Treat this node as Model(`typeName` field is missing).");
        pTyName = "Model";
      } else {
        pTyName = typeName.value();
      }

      {
        DCOUT("elemPath.prim_name = " << elemPath.prim_part());
        std::string prim_name = elemPath.prim_part();
        std::string primTypeName = typeName.has_value() ? typeName.value() : "";
        // __AnyType__
        if (typeName.has_value() && typeName.value() == "__AnyType__") {
          primTypeName = "";
        }

        // Validation check should be already done in crate-reader, so no
        // further validation required.
        if (!ValidatePrimElementName(prim_name)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Prim name.");
        }

        PrimSpec primspec;

#if 0
        bool is_unsupported_prim{false};
        auto prim = ReconstructPrimFromTypeName(pTyName, primTypeName, prim_name,
                                                node, specifier.value(), primChildren, properties,
                                                psmap, primMeta, &is_unsupported_prim);

        if (prim) {
          // Prim name
          prim.value().element_path() = elemPath;
        } else {
          if (_config.allow_unknown_prims && is_unsupported_prim) {
            // Try to reconsrtuct as Model
            prim = ReconstructPrimFromTypeName("Model", primTypeName, prim_name,
                                                    node, specifier.value(), primChildren, properties,
                                                    psmap, primMeta);
            if (prim) {
              // Prim name
              prim.value().element_path() = elemPath;
            } else {
              return false;
            }
          } else {
            return false;
          }
        }
#else
        primspec.typeName() = primTypeName;
        primspec.name() = prim_name;

        prim::PropertyMap props;
        if (!BuildPropertyMap(node.GetChildren(), psmap, &props)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to build PropertyMap.");
        }
        primspec.props() = props;
        primspec.metas() = primMeta;
        // TODO: primChildren, properties

        if (primOut) {
          (*primOut) = primspec;
        }
#endif
      }

      DCOUT("add prim idx " << current);
      if (_prim_table.count(current)) {
        DCOUT("??? prim idx already set " << current);
      } else {
        _prim_table.insert(current);
      }

      break;
    }
    case SpecType::VariantSet: {
      // Assume parent(Prim) already exists(parsed)
      // TODO: Confirm Crate format allow defining Prim after VariantSet
      // serialization.
      if (!_prim_table.count(parent)) {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "Parent Prim for this VariantSet not found.");
      }

      DCOUT(
          fmt::format("[{}] is a Variantset node(parent = {}). prim_idx? = {}",
                      current, parent, _prim_table.count(current)));

      Path elemPath;

      if (const auto &pv = GetElemPath(crate::Index(uint32_t(current)))) {
        elemPath = pv.value();

        DCOUT(fmt::format("Element path: {}", dump_path(elemPath)));

        // Ensure ElementPath is variant
        if (!tokenize_variantElement(elemPath.full_path_name())) {
          PUSH_ERROR_AND_RETURN_TAG(
              kTag, fmt::format("Invalid Variant ElementPath '{}'.", elemPath));
        }

      } else {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "(Internal errror) Element path not found.");
      }

      std::vector<value::token> variantChildren;

      // Only contains `variantChildren` field with type `token[]`

      DCOUT("== VariantSetFields begin ==> ");

      if (!ParseVariantSetFields(fvs, variantChildren)) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to parse VariantSet fields.");
        return false;
      }

      DCOUT("<== VariantSetFields end === ");

      // Add variantChildren to prim node.
      // TODO: elemPath
      if (!AddVariantChildrenToPrimNode(parent, variantChildren)) {
        return false;
      }

      break;
    }
    case SpecType::Variant: {
      // Since the Prim this Variant node belongs to is not yet reconstructed
      // during the Prim tree traversal, We manage variant node separately

      DCOUT(fmt::format("[{}] is a Variant node(parent = {}). prim_idx? = {}",
                        current, parent, _prim_table.count(current)));

      nonstd::optional<std::string> typeName;
      nonstd::optional<Specifier> specifier;
      std::vector<value::token> primChildren;
      std::vector<value::token> properties;

      PrimMeta primMeta;

      DCOUT("== VariantFields begin ==> ");

      if (!ParsePrimSpec(fvs, typeName, specifier, primChildren, properties, primMeta)) {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "Failed to parse Prim fields under Variant.");
        return false;
      }

      DCOUT("<== VariantFields end === ");

      Path elemPath;
      if (const auto &pv = GetElemPath(crate::Index(uint32_t(current)))) {
        elemPath = pv.value();
        DCOUT(fmt::format("Element path: {}", elemPath.full_path_name()));
      } else {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "(Internal errror) Element path not found.");
      }

      // Sanity check
      if (specifier) {
        if (specifier.value() == Specifier::Def) {
          // ok
        } else if (specifier.value() == Specifier::Class) {
          // ok
        } else if (specifier.value() == Specifier::Over) {
          // ok
        } else {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Specifier.");
        }
      } else {
        // Seems Variant is only composed of Properties.
        // Create pseudo `def` Prim
        // FIXME: default is `Over`?
        specifier = Specifier::Def;
      }

      std::string pTyName; // TinyUSDZ' prim typename
      if (!typeName) {
        //PUSH_WARN("Treat this node as Model(where `typeName` is missing).");
        pTyName = "Model";
      } else {
        pTyName = typeName.value();
      }

      {
        std::string prim_name = elemPath.prim_part();
        DCOUT("elemPath = " << dump_path(elemPath));
        DCOUT("prim_name = " << prim_name);

        std::string primTypeName = typeName.has_value() ? typeName.value() : "";
        // __AnyType__
        if (typeName.has_value() && typeName.value() == "__AnyType__") {
          primTypeName = "";
        }

        // Something like '{shapeVariant=Capsule}'

        std::array<std::string, 2> variantPair;
        if (!tokenize_variantElement(prim_name, &variantPair)) {
          PUSH_ERROR_AND_RETURN_TAG(
              kTag, fmt::format("Invalid Variant ElementPath '{}'.", elemPath));
        }

        std::string variantSetName = variantPair[0];
        std::string variantPrimName = variantPair[1];

        if (!ValidatePrimElementName(variantPrimName)) {
          PUSH_ERROR_AND_RETURN_TAG(
              kTag, fmt::format("Invalid Prim name in Variant: `{}`",
                                variantPrimName));
        }

#if 0
        nonstd::optional<PrimSpec> variantPrimSpec;
        bool is_unsupported_prim{false};
        variantPrim = ReconstructPrimFromTypeName(
            pTyName, primTypeName, variantPrimName, node, specifier.value(), primChildren, properties,
            psmap, primMeta, &is_unsupported_prim);

        if (variantPrim) {
          // Prim name
          variantPrim.value().element_path() =
              elemPath;  // FIXME: Use variantPrimName?

          // Prim Specifier
          variantPrim.value().specifier() = specifier.value();

          // Store variantPrim to temporary buffer.
          DCOUT(fmt::format("parent {} add prim idx {} as variant: ", parent, current));
          if (_variantPrims.count(current)) {
            DCOUT("??? prim idx already set " << current);
          } else {
            _variantPrims[current] =  variantPrim.value();
            _variantPrimChildren[parent].push_back(current);
          }
        } else {
          if (_config.allow_unknown_prims && is_unsupported_prim) {
            // Try to reconstruct as Model
            variantPrim = ReconstructPrimFromTypeName(
                "Model", primTypeName, variantPrimName, node, specifier.value(), primChildren, properties,
                psmap, primMeta);

            if (variantPrim) {
              // Prim name
              variantPrim.value().element_path() =
                  elemPath;  // FIXME: Use variantPrimName?

              // Prim Specifier
              variantPrim.value().specifier() = specifier.value();

              // Store variantPrim to temporary buffer.
              DCOUT(fmt::format("parent {} add prim idx {} as variant: ", parent, current));
              if (_variantPrims.count(current)) {
                DCOUT("??? prim idx already set " << current);
              } else {
                _variantPrims[current] = variantPrim.value();
                _variantPrimChildren[parent].push_back(current);
              }
            } else {
              return false;
            }
          } else {
            return false;
          }
        }
#else
        PrimSpec variantPrimSpec;
        variantPrimSpec.typeName() = primTypeName;
        variantPrimSpec.name() = prim_name;

        prim::PropertyMap props;
        if (!BuildPropertyMap(node.GetChildren(), psmap, &props)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to build PropertyMap.");
        }
        variantPrimSpec.props() = props;
        variantPrimSpec.metas() = primMeta;

        // Store variantPrimSpec to temporary buffer.
        DCOUT(fmt::format("parent {} add primspec idx {} as variant: ", parent, current));
        if (_variantPrimSpecs.count(current)) {
          DCOUT("??? prim idx already set " << current);
        } else {
          _variantPrimSpecs[current] = variantPrimSpec;
          _variantPrimChildren[parent].push_back(current);
        }

#endif
      }

      break;
    }
    case SpecType::Attribute: {
      if (is_parent_variant) {
        nonstd::optional<Path> path = GetPath(spec.path_index);

        if (!path) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid PathIndex.");
        }

        Property prop;
        if (!ParseProperty(spec.spec_type, fvs, &prop)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag,
                                    fmt::format("Failed to parse Attribut: {}.",
                                                path.value().prop_part()));
        }

        // Parent Prim is not yet reconstructed, so store info to temporary
        // buffer _variantAttributeNodes.
        _variantProps[current] = {path.value(), prop};
        _variantPropChildren[parent].push_back(current);

        DCOUT(
            fmt::format("parent {} current [{}] Parsed Attribute {} under Variant. PathIndex {}",
                        parent, current, path.value().prop_part(), spec.path_index));

      } else {
        // Maybe parent is Class/Over, or inherited
        PUSH_WARN(
            "TODO: SpecTypeAttribute(in conjunction with Class/Over specifier, "
            "or inherited?)");
      }
      break;
    }
    case SpecType::Connection:
    case SpecType::Relationship:
    case SpecType::RelationshipTarget: {
      PUSH_ERROR_AND_RETURN_TAG(
          kTag, fmt::format("TODO: Unsupported/Unimplemented SpecType: {}.",
                            to_string(spec.spec_type)));
      break;
    }
    case SpecType::Expression:
    case SpecType::Mapper:
    case SpecType::MapperArg: {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Unsupported SpecType: {}.",
                                                  to_string(spec.spec_type)));
      break;
    }
    case SpecType::Unknown:
    case SpecType::Invalid: {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "[InternalError] Invalid SpecType.");
      break;
    }
  }

  return true;
}